

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O0

string * __thiscall pbrt::DigitPermutation::ToString_abi_cxx11_(DigitPermutation *this)

{
  int *in_RSI;
  string *in_RDI;
  int digitValue;
  int digitIndex;
  string s;
  int *in_stack_ffffffffffffff78;
  unsigned_short *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  int local_68;
  string local_58 [36];
  int local_34;
  string local_30 [48];
  
  StringPrintf<int_const&,int_const&>
            ((char *)in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  for (local_34 = 0; local_34 < in_RSI[1]; local_34 = local_34 + 1) {
    StringPrintf<int&>((char *)in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80);
    std::__cxx11::string::operator+=(local_30,local_58);
    std::__cxx11::string::~string(local_58);
    for (local_68 = 0; local_68 < *in_RSI; local_68 = local_68 + 1) {
      StringPrintf<unsigned_short&>((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::__cxx11::string::operator+=(local_30,(string *)&stack0xffffffffffffff78);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      if (local_68 != *in_RSI + -1) {
        std::__cxx11::string::operator+=(local_30,", ");
      }
    }
    std::__cxx11::string::operator+=(local_30,") ");
  }
  std::operator+(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string DigitPermutation::ToString() const {
    std::string s = StringPrintf(
        "[ DigitPermitation base: %d nDigits: %d permutations: ", base, nDigits);
    for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
        s += StringPrintf("[%d] ( ", digitIndex);
        for (int digitValue = 0; digitValue < base; ++digitValue) {
            s += StringPrintf("%d", permutations[digitIndex * base + digitValue]);
            if (digitValue != base - 1)
                s += ", ";
        }
        s += ") ";
    }

    return s + " ]";
}